

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupWithConstr(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  Vec_Int_t *vSuper;
  int *piVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  Gia_Man_t *pGVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  int local_58;
  uint local_4c;
  
  iVar6 = p->vCos->nSize;
  if (iVar6 - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0xbfa,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0xbfb,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
  }
  if (iVar6 < 1) {
LAB_00687d11:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar1 = *p->vCos->pArray;
  lVar8 = (long)(int)uVar1;
  if ((-1 < lVar8) && ((int)uVar1 < p->nObjs)) {
    pGVar3 = p->pObjs;
    uVar7 = (uint)*(undefined8 *)(pGVar3 + lVar8);
    if ((uVar7 >> 0x1d & 1) == 0) {
      if (uVar1 != (uVar7 & 0x1fffffff)) {
        vSuper = (Vec_Int_t *)malloc(0x10);
        vSuper->nCap = 100;
        vSuper->nSize = 0;
        piVar9 = (int *)malloc(400);
        vSuper->pArray = piVar9;
        Gia_ManDupWithConstrCollectAnd_rec
                  (p,(Gia_Obj_t *)
                     ((ulong)(uVar7 >> 0x1d & 1) ^
                     (ulong)(pGVar3 + (lVar8 - (ulong)(uVar7 & 0x1fffffff)))),vSuper,1);
        uVar1 = vSuper->nSize;
        if ((long)(int)uVar1 < 2) {
          __assert_fail("Vec_IntSize(vSuper) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                        ,0xc09,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
        }
        Gia_ManLevelNum(p);
        piVar9 = vSuper->pArray;
        local_58 = -1;
        lVar8 = 0;
        local_4c = 0xffffffff;
        do {
          uVar7 = piVar9[lVar8];
          if ((int)uVar7 < 0) goto LAB_00687d30;
          uVar17 = uVar7 >> 1;
          pVVar4 = p->vLevels;
          Vec_IntFillExtra(pVVar4,uVar17 + 1,0);
          if (pVVar4->nSize <= (int)uVar17) goto LAB_00687d11;
          if (local_58 < pVVar4->pArray[uVar17]) {
            pVVar4 = p->vLevels;
            Vec_IntFillExtra(pVVar4,uVar17 + 1,0);
            if (pVVar4->nSize <= (int)uVar17) goto LAB_00687d11;
            local_58 = pVVar4->pArray[uVar17];
            local_4c = uVar7;
          }
          lVar8 = lVar8 + 1;
        } while ((int)uVar1 != lVar8);
        if (local_4c == 0xffffffff) {
          __assert_fail("iLitBest != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                        ,0xc0f,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
        }
        p_00 = Gia_ManStart(p->nObjs);
        pcVar14 = p->pName;
        if (pcVar14 == (char *)0x0) {
          pcVar11 = (char *)0x0;
        }
        else {
          sVar10 = strlen(pcVar14);
          pcVar11 = (char *)malloc(sVar10 + 1);
          strcpy(pcVar11,pcVar14);
        }
        p_00->pName = pcVar11;
        pcVar14 = p->pSpec;
        if (pcVar14 == (char *)0x0) {
          pcVar11 = (char *)0x0;
        }
        else {
          sVar10 = strlen(pcVar14);
          pcVar11 = (char *)malloc(sVar10 + 1);
          strcpy(pcVar11,pcVar14);
        }
        p_00->pSpec = pcVar11;
        p->pObjs->Value = 0;
        Gia_ManHashAlloc(p_00);
        if (1 < p->nObjs) {
          lVar8 = 1;
          lVar16 = 0x14;
          do {
            pGVar3 = p->pObjs;
            uVar15 = *(ulong *)((long)pGVar3 + lVar16 + -8);
            if ((uVar15 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar15 < 0) {
              if (((uint)uVar15 & 0x9fffffff) == 0x9fffffff) {
                pGVar12 = Gia_ManAppendObj(p_00);
                uVar15 = *(ulong *)pGVar12;
                *(ulong *)pGVar12 = uVar15 | 0x9fffffff;
                *(ulong *)pGVar12 =
                     uVar15 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar5 = p_00->pObjs;
                if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) {
LAB_00687d8d:
                  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                }
                Vec_IntPush(p_00->vCis,
                            (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
                pGVar5 = p_00->pObjs;
                if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) goto LAB_00687d8d;
                iVar6 = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
                goto LAB_00687bcf;
              }
            }
            else {
              uVar7 = *(uint *)((long)pGVar3 +
                               lVar16 + (ulong)(uint)((int)(uVar15 & 0x1fffffff) << 2) * -3);
              if (((int)uVar7 < 0) ||
                 (uVar17 = *(uint *)((long)pGVar3 +
                                    lVar16 + (ulong)((uint)(uVar15 >> 0x1e) & 0x7ffffffc) * -3),
                 (int)uVar17 < 0)) goto LAB_00687d4f;
              iVar6 = Gia_ManHashAnd(p_00,uVar7 ^ (uint)(uVar15 >> 0x1d) & 1,
                                     uVar17 ^ (uint)(uVar15 >> 0x3d) & 1);
LAB_00687bcf:
              *(int *)(&pGVar3->field_0x0 + lVar16) = iVar6;
            }
            lVar8 = lVar8 + 1;
            lVar16 = lVar16 + 0xc;
          } while (lVar8 < p->nObjs);
        }
        uVar7 = 0xffffffff;
        uVar15 = 0;
        do {
          uVar17 = piVar9[uVar15];
          if (uVar17 != local_4c) {
            if (uVar7 == 0xffffffff) {
              if ((int)uVar17 < 0) goto LAB_00687d30;
              if (p->nObjs <= (int)(uVar17 >> 1)) goto LAB_00687d6e;
              uVar7 = p->pObjs[uVar17 >> 1].Value;
              if ((int)uVar7 < 0) goto LAB_00687d4f;
              uVar7 = uVar7 ^ uVar17 & 1;
            }
            else {
              if ((int)uVar17 < 0) goto LAB_00687d30;
              if (p->nObjs <= (int)(uVar17 >> 1)) goto LAB_00687d6e;
              uVar2 = p->pObjs[uVar17 >> 1].Value;
              if ((int)uVar2 < 0) goto LAB_00687d4f;
              uVar7 = Gia_ManHashAnd(p_00,uVar7,uVar2 ^ uVar17 & 1);
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar1 != uVar15);
        if ((int)local_4c < 0) {
LAB_00687d30:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        if ((int)(local_4c >> 1) < p->nObjs) {
          uVar1 = p->pObjs[local_4c >> 1].Value;
          if (-1 < (int)uVar1) {
            Gia_ManAppendCo(p_00,uVar1 ^ local_4c & 1);
            if (-1 < (int)uVar7) {
              Gia_ManAppendCo(p_00,uVar7 ^ 1);
              p_00->nConstrs = 1;
              pGVar13 = Gia_ManCleanup(p_00);
              Gia_ManStop(p_00);
              free(piVar9);
              free(vSuper);
              return pGVar13;
            }
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10e,"int Abc_LitNot(int)");
          }
LAB_00687d4f:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10f,"int Abc_LitNotCond(int, int)");
        }
        goto LAB_00687d6e;
      }
      pcVar14 = "The miter\'s output is a constant.";
    }
    else {
      pcVar14 = "The miter\'s output is not AND-decomposable.";
    }
    puts(pcVar14);
    return (Gia_Man_t *)0x0;
  }
LAB_00687d6e:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupWithConstr( Gia_Man_t * p )
{
    Vec_Int_t * vSuper;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iDriver, iLit, iLitBest = -1, LevelBest = -1;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Gia_ManRegNum(p) == 0 );
    pObj = Gia_ManPo( p, 0 );
    if ( Gia_ObjFaninC0(pObj) )
    {
        printf( "The miter's output is not AND-decomposable.\n" );
        return NULL;
    }
    if ( Gia_ObjFaninId0p(p, pObj) == 0 )
    {
        printf( "The miter's output is a constant.\n" );
        return NULL;
    }
    vSuper = Vec_IntAlloc( 100 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild0(pObj), vSuper, 1 );
    assert( Vec_IntSize(vSuper) > 1 );
    // find the highest level
    Gia_ManLevelNum( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
        if ( LevelBest < Gia_ObjLevelId(p, Abc_Lit2Var(iLit)) )
            LevelBest = Gia_ObjLevelId(p, Abc_Lit2Var(iLit)), iLitBest = iLit;
    assert( iLitBest != -1 );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create AND of nodes
    iDriver = -1;
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        if ( iLit == iLitBest )
            continue;
        if ( iDriver == -1 )
            iDriver = Gia_ObjLitCopy(p, iLit);
        else
            iDriver = Gia_ManHashAnd( pNew, iDriver, Gia_ObjLitCopy(p, iLit) );
    }
    // create the main PO
    Gia_ManAppendCo( pNew, Gia_ObjLitCopy(p, iLitBest) );
    // create the constraint PO
    Gia_ManAppendCo( pNew, Abc_LitNot(iDriver) );
    pNew->nConstrs = 1;
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vSuper );
    return pNew;

}